

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall AActor::SetState(AActor *this,FState *newstate,bool nofunction)

{
  ushort uVar1;
  player_t *ppVar2;
  char *pcVar3;
  FState *pFVar4;
  FPlayerSkin *pFVar5;
  bool bVar6;
  int iVar7;
  PClassActor *pPVar8;
  PClass *pPVar9;
  int32_t iVar10;
  FState *returned_state;
  FStateParamInfo stp;
  
  if (((debugfile != (FILE *)0x0) && (ppVar2 = this->player, ppVar2 != (player_t *)0x0)) &&
     ((ppVar2->cheats & 0x2000) != 0)) {
    fprintf((FILE *)debugfile,"for pl %td: SetState while predicting!\n",
            (long)&ppVar2[-0x916e].morphTics / 0x2a0);
  }
LAB_0042544c:
  do {
    if (newstate == (FState *)0x0) {
      this->state = (FState *)0x0;
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
      return false;
    }
    iVar10 = -1;
    if (this->state != (FState *)0x0) {
      iVar10 = this->state->sprite;
    }
    if ((newstate->UseFlags & 1) == 0) {
      pPVar8 = FState::StaticFindStateOwner(newstate);
      pcVar3 = FName::NameData.NameArray
               [(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                Index].Text;
      pFVar4 = pPVar8->OwnedStates;
      pPVar9 = DObject::GetClass((DObject *)this);
      Printf("\x1cGState %s.%d in %s not flagged for use as an actor sprite\n",pcVar3,
             ((long)newstate - (long)pFVar4) / 0x28 & 0xffffffff,
             FName::NameData.NameArray
             [(pPVar9->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text);
      this->state = (FState *)0x0;
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
      return false;
    }
    this->state = newstate;
    iVar7 = GetTics(this,newstate);
    this->tics = iVar7;
    uVar1 = newstate->StateFlags;
    (this->renderflags).Value = ((this->renderflags).Value & 0xffffffef) + (uVar1 & 4) * 4;
    iVar7 = newstate->sprite;
    if (iVar7 != 1) {
      if ((uVar1 & 0x10) == 0) {
        this->frame = newstate->Frame;
      }
      pFVar5 = skins;
      if (iVar7 != 2) {
        if ((((this->flags4).Value & 0x20) == 0) && (iVar7 == this->SpawnState->sprite)) {
          if (skins == (FPlayerSkin *)0x0 || this->player == (player_t *)0x0) {
            if (iVar7 == iVar10) goto LAB_00425536;
          }
          else {
            iVar7 = userinfo_t::GetSkin(&this->player->userinfo);
            iVar7 = pFVar5[iVar7].sprite;
          }
        }
        this->sprite = iVar7;
      }
    }
LAB_00425536:
    if (!nofunction) {
      stp.mStateType = STATE_Actor;
      stp.mPSPIndex = 1;
      stp.mCallingState = newstate;
      bVar6 = FState::CallAction(newstate,this,this,&stp,&returned_state);
      if (bVar6) {
        if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          return false;
        }
        if (returned_state != (FState *)0x0) {
          this->tics = 0;
          newstate = returned_state;
          goto LAB_0042544c;
        }
      }
    }
    newstate = newstate->NextState;
    if (this->tics != 0) {
      if (Renderer != (FRenderer *)0x0) {
        (*Renderer->_vptr_FRenderer[8])(Renderer,this);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool AActor::SetState (FState *newstate, bool nofunction)
{
	if (debugfile && player && (player->cheats & CF_PREDICTING))
		fprintf (debugfile, "for pl %td: SetState while predicting!\n", player-players);
	do
	{
		if (newstate == NULL)
		{
			state = NULL;
			Destroy ();
			return false;
		}
		int prevsprite, newsprite;

		if (state != NULL)
		{
			prevsprite = state->sprite;
		}
		else
		{
			prevsprite = -1;
		}
		if (!(newstate->UseFlags & SUF_ACTOR))
		{
			auto so = FState::StaticFindStateOwner(newstate);
			Printf(TEXTCOLOR_RED "State %s.%d in %s not flagged for use as an actor sprite\n", so->TypeName.GetChars(), int(newstate - so->OwnedStates), GetClass()->TypeName.GetChars());
			state = nullptr;
			Destroy();
			return false;
		}
		state = newstate;
		tics = GetTics(newstate);
		renderflags = (renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (newstate->GetFullbright());
		newsprite = newstate->sprite;
		if (newsprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				frame = newstate->GetFrame();
			}
			if (newsprite != SPR_NOCHANGE)
			{ // okay to change sprite
				if (!(flags4 & MF4_NOSKIN) && newsprite == SpawnState->sprite)
				{ // [RH] If the new sprite is the same as the original sprite, and
				// this actor is attached to a player, use the player's skin's
				// sprite. If a player is not attached, do not change the sprite
				// unless it is different from the previous state's sprite; a
				// player may have been attached, died, and respawned elsewhere,
				// and we do not want to lose the skin on the body. If it wasn't
				// for Dehacked, I would move sprite changing out of the states
				// altogether, since actors rarely change their sprites after
				// spawning.
					if (player != NULL && skins != NULL)
					{
						sprite = skins[player->userinfo.GetSkin()].sprite;
					}
					else if (newsprite != prevsprite)
					{
						sprite = newsprite;
					}
				}
				else
				{
					sprite = newsprite;
				}
			}
		}

		if (!nofunction)
		{
			FState *returned_state;
			FStateParamInfo stp = { newstate, STATE_Actor, PSP_WEAPON };
			if (newstate->CallAction(this, this, &stp, &returned_state))
			{
				// Check whether the called action function resulted in destroying the actor
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return false;
				}
				if (returned_state != NULL)
				{ // The action was an A_Jump-style function that wants to change the next state.
					newstate = returned_state;
					tics = 0;		 // make sure we loop and set the new state properly
					continue;
				}
			}
		}
		newstate = newstate->GetNextState();
	} while (tics == 0);

	if (Renderer != NULL)
	{
		Renderer->StateChanged(this);
	}
	return true;
}